

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder_tests.cpp
# Opt level: O0

void anon_unknown.dwarf_a0110::test_equal
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *v,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *expected)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  ExprLhs<const_unsigned_long_&> EVar1;
  AssertionHandler *pAVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  AssertionHandler catchAssertionHandler_1;
  size_t i;
  AssertionHandler catchAssertionHandler;
  undefined4 in_stack_fffffffffffffe28;
  Flags in_stack_fffffffffffffe2c;
  AssertionHandler *in_stack_fffffffffffffe30;
  ExprLhs<const_unsigned_char_&> in_stack_fffffffffffffe38;
  AssertionHandler *in_stack_fffffffffffffe40;
  AssertionHandler *this;
  SourceLineInfo *this_00;
  size_type in_stack_fffffffffffffe50;
  unsigned_long *in_stack_fffffffffffffe60;
  ExprLhs<const_unsigned_char_&> rhs;
  ExprLhs<const_unsigned_long_&> *in_stack_fffffffffffffe68;
  AssertionHandler local_158;
  AssertionHandler *local_f0;
  size_type local_e8;
  size_type local_d0;
  unsigned_long *local_c0;
  SourceLineInfo local_78;
  StringRef local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_68 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffe30,
                        CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  this_00 = &local_78;
  Catch::SourceLineInfo::SourceLineInfo
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_encoder_tests.cpp"
             ,0x14);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38.m_lhs);
  capturedExpression.m_size = in_stack_fffffffffffffe50;
  capturedExpression.m_start = (char *)this_00;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffe40,(StringRef *)in_stack_fffffffffffffe38.m_lhs,
             (SourceLineInfo *)in_stack_fffffffffffffe30,capturedExpression,
             in_stack_fffffffffffffe2c);
  local_d0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_8);
  EVar1 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                     (unsigned_long *)0x22d3d4);
  local_c0 = EVar1.m_lhs;
  local_e8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_10);
  Catch::ExprLhs<unsigned_long_const&>::operator==
            (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffe30,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  Catch::BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&>::~BinaryExpr
            ((BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&> *)0x22d440);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffe30);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffe30);
  local_f0 = (AssertionHandler *)0x0;
  while( true ) {
    this = local_f0;
    pAVar2 = (AssertionHandler *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_8);
    if (pAVar2 <= this) break;
    local_158.m_assertionInfo.lineInfo =
         (SourceLineInfo)
         operator____catch_sr
                   ((char *)in_stack_fffffffffffffe30,
                    CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    in_stack_fffffffffffffe30 = &local_158;
    Catch::SourceLineInfo::SourceLineInfo
              ((SourceLineInfo *)in_stack_fffffffffffffe30,
               "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_encoder_tests.cpp"
               ,0x18);
    Catch::StringRef::StringRef((StringRef *)this,(char *)in_stack_fffffffffffffe38.m_lhs);
    capturedExpression_00.m_size = (size_type)EVar1.m_lhs;
    capturedExpression_00.m_start = (char *)this_00;
    Catch::AssertionHandler::AssertionHandler
              (this,(StringRef *)in_stack_fffffffffffffe38.m_lhs,
               (SourceLineInfo *)in_stack_fffffffffffffe30,capturedExpression_00,
               in_stack_fffffffffffffe2c);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              (local_8,(size_type)local_f0);
    in_stack_fffffffffffffe38 =
         Catch::Decomposer::operator<=
                   ((Decomposer *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                    (uchar *)0x22d58f);
    rhs = in_stack_fffffffffffffe38;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              (local_10,(size_type)local_f0);
    Catch::ExprLhs<unsigned_char_const&>::operator==
              ((ExprLhs<const_unsigned_char_&> *)in_stack_fffffffffffffe68,rhs.m_lhs);
    Catch::AssertionHandler::handleExpr
              (in_stack_fffffffffffffe30,
               (ITransientExpression *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)
              );
    Catch::BinaryExpr<const_unsigned_char_&,_const_unsigned_char_&>::~BinaryExpr
              ((BinaryExpr<const_unsigned_char_&,_const_unsigned_char_&> *)0x22d5e7);
    Catch::AssertionHandler::complete(in_stack_fffffffffffffe30);
    Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffe30);
    local_f0 = (AssertionHandler *)((long)&(local_f0->m_assertionInfo).macroName.m_start + 1);
  }
  return;
}

Assistant:

void test_equal(const std::vector<uint8_t>& v, const std::vector<uint8_t>& expected)
    {
        REQUIRE(v.size() == expected.size());

        for (std::size_t i = 0; i < v.size(); ++i)
        {
            CHECK(v[i] == expected[i]);
        }
    }